

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O3

UBool MBCSAddFromUnicode(MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint8_t *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  sbyte sVar9;
  byte bVar10;
  uint32_t uVar11;
  uint16_t *puVar12;
  byte *pbVar13;
  byte *pbVar14;
  char cVar15;
  char cVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  undefined4 uVar20;
  undefined7 in_register_00000081;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  char buffer [10];
  char local_42 [10];
  UChar32 local_38;
  undefined4 local_34;
  
  uVar21 = (mbcsData->ucm->states).maxCharLength;
  if ((((mbcsData->ucm->states).outputType == '\f') && (IGNORE_SISO_CHECK == '\0')) &&
     ((*bytes & 0xfe) == 0xe)) {
    MBCSAddFromUnicode();
    return '\0';
  }
  if ((length == 1 && flag == '\x01') && (*bytes == '\0')) {
    fprintf(_stderr,"error: unable to encode a |1 fallback from U+%04x to 0x%02x\n",(ulong)(uint)c,0
           );
    return '\0';
  }
  uVar20 = (undefined4)CONCAT71(in_register_00000081,flag);
  puVar4 = mbcsData->fromUBytes;
  uVar6 = c >> 10;
  cVar15 = mbcsData->utf8Friendly;
  local_34 = uVar20;
  if (cVar15 == '\0') {
    uVar22 = (uint)c >> 4 & 0x3f;
    if (mbcsData->stage1[uVar6] == 0) {
      puVar12 = mbcsData->stage1 + uVar6;
      uVar23 = mbcsData->stage2Top;
      goto LAB_001dd99e;
    }
    uVar22 = uVar22 + mbcsData->stage1[uVar6];
LAB_001dd9f0:
    sVar9 = 4;
    uVar6 = 0xf;
  }
  else {
    uVar3 = mbcsData->utf8Max;
    if ((int)(uint)uVar3 < c) {
      uVar22 = (uint)c >> 4 & 0x3f;
    }
    else {
      uVar22 = (uint)c >> 4 & 0x3c;
    }
    if (mbcsData->stage1[uVar6] == 0) {
      puVar12 = mbcsData->stage1 + uVar6;
      uVar7 = mbcsData->stage2Top;
      uVar19 = (ulong)uVar7;
      uVar17 = uVar7 - uVar22;
      uVar18 = uVar17;
      if (uVar7 < uVar17) {
        uVar18 = uVar7;
      }
      uVar7 = uVar7 + 1;
      do {
        uVar23 = uVar18;
        if (uVar19 <= uVar17) break;
        uVar7 = uVar7 - 1;
        lVar5 = uVar19 - 1;
        uVar19 = uVar19 - 1;
        uVar23 = uVar7;
      } while (mbcsData->stage2[lVar5] == 0);
LAB_001dd99e:
      if (0xfbc0 < uVar23 + 0x40) {
        MBCSAddFromUnicode();
        return '\0';
      }
      uVar7 = 0;
      if (uVar23 < 0xffffffc0) {
        mbcsData->stage1[uVar6] = (uint16_t)uVar23;
        uVar7 = (uint)*puVar12;
      }
      uVar22 = uVar22 + uVar7;
      mbcsData->stage2Top = uVar23 + 0x40;
      if (cVar15 == '\0') goto LAB_001dd9f0;
      uVar3 = mbcsData->utf8Max;
    }
    else {
      uVar22 = uVar22 + mbcsData->stage1[uVar6];
    }
    sVar9 = (c <= (int)(uint)uVar3) * '\x02' + 4;
    uVar6 = 0x3f;
    if ((int)(uint)uVar3 < c) {
      uVar6 = 0xf;
    }
  }
  uVar6 = uVar6 & c;
  uVar11 = mbcsData->stage2[uVar22];
  if (uVar11 == 0) {
    uVar23 = mbcsData->stage3Top;
    if ((cVar15 != '\0') && (0xf < uVar6)) {
      uVar7 = (uVar6 & 0xfffffff0) * uVar21;
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar19 = 0;
        uVar18 = uVar23;
        do {
          uVar18 = uVar18 - 1;
          if (puVar4[uVar18] != '\0') {
            uVar7 = (uint)uVar19;
            break;
          }
          uVar19 = uVar19 + 1;
        } while (uVar7 != uVar19);
        uVar7 = uVar7 >> 4;
      }
      uVar23 = uVar23 + (uVar7 / uVar21) * uVar21 * -0x10;
    }
    uVar7 = (uVar21 << sVar9) + uVar23;
    local_38 = c;
    if (uVar21 << 0x14 < uVar7) {
      MBCSAddFromUnicode();
      return '\0';
    }
    if (uVar23 < uVar7) {
      uVar18 = uVar22;
      do {
        uVar19 = (ulong)uVar18;
        uVar18 = uVar18 + 1;
        mbcsData->stage2[uVar19] = (uVar23 >> 4) / uVar21;
        uVar23 = uVar23 + uVar21 * 0x10;
      } while (uVar23 < uVar7);
    }
    mbcsData->stage3Top = uVar7;
    uVar11 = mbcsData->stage2[uVar22];
  }
  uVar23 = uVar11 << 4 & 0xffff0;
  if ((cVar15 != '\0') && (c <= (int)(uint)mbcsData->utf8Max)) {
    if (uVar23 < 0x10000) {
      mbcsData->stageUTF8[c >> 6] = (uint16_t)(uVar11 << 4);
    }
    else {
      mbcsData->utf8Max = 0xfeff;
    }
  }
  uVar18 = 0;
  uVar7 = 0;
  pbVar13 = bytes;
  if (length == 2) {
LAB_001ddb3a:
    pbVar14 = pbVar13 + 1;
    uVar18 = (*pbVar13 | uVar18) << 8;
  }
  else {
    pbVar14 = bytes;
    if (length == 3) {
LAB_001ddb2d:
      pbVar13 = pbVar14 + 1;
      uVar18 = (*pbVar14 | uVar7) << 8;
      goto LAB_001ddb3a;
    }
    if (length == 4) {
      pbVar14 = bytes + 1;
      uVar7 = (uint)*bytes << 8;
      goto LAB_001ddb2d;
    }
  }
  bVar10 = *pbVar14;
  uVar7 = uVar18 | bVar10;
  uVar19 = (ulong)((uVar23 + uVar6) * uVar21);
  if (uVar21 == 4) {
    uVar23 = *(uint *)(puVar4 + uVar19);
    *(uint *)(puVar4 + uVar19) = uVar7;
  }
  else if (uVar21 == 3) {
    bVar2 = puVar4[uVar19];
    puVar4[uVar19] = (uint8_t)(uVar18 >> 0x10);
    bVar1 = puVar4[uVar19 + 1];
    puVar4[uVar19 + 1] = (uint8_t)(uVar18 >> 8);
    uVar23 = (uint)puVar4[uVar19 + 2] | (uint)bVar1 << 8 | (uint)bVar2 << 0x10;
    puVar4[uVar19 + 2] = bVar10;
  }
  else {
    uVar23 = 0;
    if (uVar21 == 2) {
      uVar23 = (uint)*(ushort *)(puVar4 + uVar19);
      *(short *)(puVar4 + uVar19) = (short)uVar7;
    }
  }
  bVar10 = (byte)c & 0xf | 0x10;
  uVar22 = (uVar6 >> 4) + uVar22;
  uVar21 = mbcsData->stage2[uVar22];
  if (((uVar21 >> bVar10 & 1) != 0) || (uVar23 != 0)) {
    if (-1 < flag) {
      if (length < 1) {
        pcVar8 = local_42;
      }
      else {
        uVar21 = length + 1;
        pcVar8 = local_42;
        do {
          bVar10 = *bytes;
          cVar15 = '0';
          cVar16 = '0';
          if (0x9f < bVar10) {
            cVar16 = 'W';
          }
          *pcVar8 = cVar16 + (bVar10 >> 4);
          if (9 < (bVar10 & 0xf)) {
            cVar15 = 'W';
          }
          pcVar8[1] = cVar15 + (bVar10 & 0xf);
          pcVar8 = pcVar8 + 2;
          bytes = bytes + 1;
          uVar21 = uVar21 - 1;
        } while (1 < uVar21);
      }
      *pcVar8 = '\0';
      fprintf(_stderr,"error: duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
              (ulong)(uint)c,local_42);
      return '\0';
    }
    if (VERBOSE == '\0') goto LAB_001ddc0b;
    if (length < 1) {
      pcVar8 = local_42;
    }
    else {
      uVar21 = length + 1;
      pcVar8 = local_42;
      do {
        bVar2 = *bytes;
        cVar15 = '0';
        cVar16 = '0';
        if (0x9f < bVar2) {
          cVar16 = 'W';
        }
        *pcVar8 = cVar16 + (bVar2 >> 4);
        if (9 < (bVar2 & 0xf)) {
          cVar15 = 'W';
        }
        pcVar8[1] = cVar15 + (bVar2 & 0xf);
        pcVar8 = pcVar8 + 2;
        bytes = bytes + 1;
        uVar21 = uVar21 - 1;
      } while (1 < uVar21);
    }
    uVar20 = local_34;
    *pcVar8 = '\0';
    fprintf(_stderr,"duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",(ulong)(uint)c,
            local_42);
  }
  if ('\0' < (char)uVar20) {
    return '\x01';
  }
  uVar21 = mbcsData->stage2[uVar22];
LAB_001ddc0b:
  mbcsData->stage2[uVar22] = (uint)(1L << bVar10) | uVar21;
  return '\x01';
}

Assistant:

static UBool
MBCSAddFromUnicode(MBCSData *mbcsData,
                   const uint8_t *bytes, int32_t length,
                   UChar32 c,
                   int8_t flag) {
    char buffer[10];
    const uint8_t *pb;
    uint8_t *stage3, *p;
    uint32_t idx, b, old, stage3Index;
    int32_t maxCharLength;

    uint32_t blockSize, newTop, i, nextOffset, newBlock, min, overlap, maxOverlap;

    maxCharLength=mbcsData->ucm->states.maxCharLength;

    if( mbcsData->ucm->states.outputType==MBCS_OUTPUT_2_SISO &&
        (!IGNORE_SISO_CHECK && (*bytes==0xe || *bytes==0xf))
    ) {
        fprintf(stderr, "error: illegal mapping to SI or SO for SI/SO codepage: U+%04x<->0x%s\n",
            (int)c, printBytes(buffer, bytes, length));
        return FALSE;
    }

    if(flag==1 && length==1 && *bytes==0) {
        fprintf(stderr, "error: unable to encode a |1 fallback from U+%04x to 0x%02x\n",
            (int)c, *bytes);
        return FALSE;
    }

    /*
     * Walk down the triple-stage compact array ("trie") and
     * allocate parts as necessary.
     * Note that the first stage 2 and 3 blocks are reserved for
     * all-unassigned mappings.
     * We assume that length<=maxCharLength and that c<=0x10ffff.
     */
    stage3=mbcsData->fromUBytes;

    /* inspect stage 1 */
    idx=c>>MBCS_STAGE_1_SHIFT;
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        nextOffset=(c>>MBCS_STAGE_2_SHIFT)&MBCS_STAGE_2_BLOCK_MASK&~(MBCS_UTF8_STAGE_3_BLOCKS-1);
    } else {
        nextOffset=(c>>MBCS_STAGE_2_SHIFT)&MBCS_STAGE_2_BLOCK_MASK;
    }
    if(mbcsData->stage1[idx]==MBCS_STAGE_2_ALL_UNASSIGNED_INDEX) {
        /* allocate another block in stage 2 */
        newBlock=mbcsData->stage2Top;
        if(mbcsData->utf8Friendly) {
            min=newBlock-nextOffset; /* minimum block start with overlap */
            while(min<newBlock && mbcsData->stage2[newBlock-1]==0) {
                --newBlock;
            }
        }
        newTop=newBlock+MBCS_STAGE_2_BLOCK_SIZE;

        if(newTop>MBCS_MAX_STAGE_2_TOP) {
            fprintf(stderr, "error: too many stage 2 entries at U+%04x<->0x%s\n",
                (int)c, printBytes(buffer, bytes, length));
            return FALSE;
        }

        /*
         * each stage 2 block contains 64 32-bit words:
         * 6 code point bits 9..4 with value with bits 31..16 "assigned" flags and bits 15..0 stage 3 index
         */
        i=idx;
        while(newBlock<newTop) {
            mbcsData->stage1[i++]=(uint16_t)newBlock;
            newBlock+=MBCS_STAGE_2_BLOCK_SIZE;
        }
        mbcsData->stage2Top=newTop; /* ==newBlock */
    }

    /* inspect stage 2 */
    idx=mbcsData->stage1[idx]+nextOffset;
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        /* allocate 64-entry blocks for UTF-8-friendly lookup */
        blockSize=MBCS_UTF8_STAGE_3_BLOCK_SIZE*maxCharLength;
        nextOffset=c&MBCS_UTF8_STAGE_3_BLOCK_MASK;
    } else {
        blockSize=MBCS_STAGE_3_BLOCK_SIZE*maxCharLength;
        nextOffset=c&MBCS_STAGE_3_BLOCK_MASK;
    }
    if(mbcsData->stage2[idx]==0) {
        /* allocate another block in stage 3 */
        newBlock=mbcsData->stage3Top;
        if(mbcsData->utf8Friendly && nextOffset>=MBCS_STAGE_3_GRANULARITY) {
            /*
             * Overlap stage 3 blocks only in multiples of 16-entry blocks
             * because of the indexing granularity in stage 2.
             */
            maxOverlap=(nextOffset&~(MBCS_STAGE_3_GRANULARITY-1))*maxCharLength;
            for(overlap=0;
                overlap<maxOverlap && stage3[newBlock-overlap-1]==0;
                ++overlap) {}

            overlap=(overlap/MBCS_STAGE_3_GRANULARITY)/maxCharLength;
            overlap=(overlap*MBCS_STAGE_3_GRANULARITY)*maxCharLength;

            newBlock-=overlap;
        }
        newTop=newBlock+blockSize;

        if(newTop>MBCS_STAGE_3_MBCS_SIZE*(uint32_t)maxCharLength) {
            fprintf(stderr, "error: too many code points at U+%04x<->0x%s\n",
                (int)c, printBytes(buffer, bytes, length));
            return FALSE;
        }
        /* each block has 16*maxCharLength bytes */
        i=idx;
        while(newBlock<newTop) {
            mbcsData->stage2[i++]=(newBlock/MBCS_STAGE_3_GRANULARITY)/maxCharLength;
            newBlock+=MBCS_STAGE_3_BLOCK_SIZE*maxCharLength;
        }
        mbcsData->stage3Top=newTop; /* ==newBlock */
    }

    stage3Index=MBCS_STAGE_3_GRANULARITY*(uint32_t)(uint16_t)mbcsData->stage2[idx];

    /* Build an alternate, UTF-8-friendly stage table as well. */
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        /* Overflow for uint16_t entries in stageUTF8? */
        if(stage3Index>0xffff) {
            /*
             * This can occur only if the mapping table is nearly perfectly filled and if
             * utf8Max==0xffff.
             * (There is no known charset like this. GB 18030 does not map
             * surrogate code points and LMBCS does not map 256 PUA code points.)
             *
             * Otherwise, stage3Index<=MBCS_UTF8_LIMIT<0xffff
             * (stage3Index can at most reach exactly MBCS_UTF8_LIMIT)
             * because we have a sorted table and there are at most MBCS_UTF8_LIMIT
             * mappings with 0<=c<MBCS_UTF8_LIMIT, and there is only also
             * the initial all-unassigned block in stage3.
             *
             * Solution for the overflow: Reduce utf8Max to the next lower value, 0xfeff.
             *
             * (See svn revision 20866 of the markus/ucnvutf8 feature branch for
             * code that causes MBCSAddTable() to rebuild the table not utf8Friendly
             * in case of overflow. That code was not tested.)
             */
            mbcsData->utf8Max=0xfeff;
        } else {
            /*
             * The stage 3 block has been assigned for the regular trie.
             * Just copy its index into stageUTF8[], without the granularity.
             */
            mbcsData->stageUTF8[c>>MBCS_UTF8_STAGE_SHIFT]=(uint16_t)stage3Index;
        }
    }

    /* write the codepage bytes into stage 3 and get the previous bytes */

    /* assemble the bytes into a single integer */
    pb=bytes;
    b=0;
    switch(length) {
    case 4:
        b=*pb++;
        U_FALLTHROUGH;
    case 3:
        b=(b<<8)|*pb++;
        U_FALLTHROUGH;
    case 2:
        b=(b<<8)|*pb++;
        U_FALLTHROUGH;
    case 1:
    default:
        b=(b<<8)|*pb++;
        break;
    }

    old=0;
    p=stage3+(stage3Index+nextOffset)*maxCharLength;
    switch(maxCharLength) {
    case 2:
        old=*(uint16_t *)p;
        *(uint16_t *)p=(uint16_t)b;
        break;
    case 3:
        old=(uint32_t)*p<<16;
        *p++=(uint8_t)(b>>16);
        old|=(uint32_t)*p<<8;
        *p++=(uint8_t)(b>>8);
        old|=*p;
        *p=(uint8_t)b;
        break;
    case 4:
        old=*(uint32_t *)p;
        *(uint32_t *)p=b;
        break;
    default:
        /* will never occur */
        break;
    }

    /* check that this Unicode code point was still unassigned */
    if((mbcsData->stage2[idx+(nextOffset>>MBCS_STAGE_2_SHIFT)]&(1UL<<(16+(c&0xf))))!=0 || old!=0) {
        if(flag>=0) {
            fprintf(stderr, "error: duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
                (int)c, printBytes(buffer, bytes, length), (int)old);
            return FALSE;
        } else if(VERBOSE) {
            fprintf(stderr, "duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
                (int)c, printBytes(buffer, bytes, length), (int)old);
        }
        /* continue after the above warning if the precision of the mapping is
           unspecified */
    }
    if(flag<=0) {
        /* set the roundtrip flag */
        mbcsData->stage2[idx+(nextOffset>>4)]|=(1UL<<(16+(c&0xf)));
    }

    return TRUE;
}